

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  qint16 y2;
  qint16 x2;
  qint16 y1;
  qint16 x1;
  qint32 local_48;
  qint32 local_44;
  qint32 local_40;
  qint32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->ver == 1) {
    local_3c = CONCAT22(local_3c._2_2_,0xaaaa);
    local_40 = CONCAT22(local_40._2_2_,0xaaaa);
    local_44 = CONCAT22(local_44._2_2_,0xaaaa);
    local_48 = CONCAT22(local_48._2_2_,0xaaaa);
    QDataStream::operator>>(s,(qint16 *)&local_3c);
    QDataStream::operator>>(s,(qint16 *)&local_40);
    QDataStream::operator>>(s,(qint16 *)&local_44);
    QDataStream::operator>>(s,(qint16 *)&local_48);
    iVar4 = (int)(short)local_3c;
    iVar1 = (int)(short)local_40;
    iVar2 = (int)(short)local_44;
    iVar3 = (int)(short)local_48;
  }
  else {
    local_3c = -0x55555556;
    local_40 = -0x55555556;
    local_44 = -0x55555556;
    local_48 = -0x55555556;
    QDataStream::operator>>(s,&local_3c);
    QDataStream::operator>>(s,&local_40);
    QDataStream::operator>>(s,&local_44);
    QDataStream::operator>>(s,&local_48);
    iVar4 = local_3c;
    iVar1 = local_40;
    iVar2 = local_44;
    iVar3 = local_48;
  }
  (r->x1).m_i = iVar4;
  (r->y1).m_i = iVar1;
  (r->x2).m_i = iVar2;
  (r->y2).m_i = iVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRect &r)
{
    if (s.version() == 1) {
        qint16 x1, y1, x2, y2;
        s >> x1; s >> y1; s >> x2; s >> y2;
        r.setCoords(x1, y1, x2, y2);
    }
    else {
        qint32 x1, y1, x2, y2;
        s >> x1; s >> y1; s >> x2; s >> y2;
        r.setCoords(x1, y1, x2, y2);
    }
    return s;
}